

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceStringsWrapper.cpp
# Opt level: O1

bool __thiscall ResourceStringsWrapper::wrap(ResourceStringsWrapper *this)

{
  ushort uVar1;
  Executable *exec;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExeNodeWrapper *dataAddr;
  Executable *pEVar5;
  _func_int **pp_Var6;
  ExeNodeWrapper *this_00;
  ulong dataSize;
  ExeNodeWrapper *local_38;
  
  (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
    super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  this->parsedSize = 0;
  iVar3 = (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    iVar4 = (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
              super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xd])(this);
    dataAddr = (ExeNodeWrapper *)
               ResourceContentWrapper::getContentRaw(&this->super_ResourceContentWrapper);
    do {
      if (CONCAT44(extraout_var_00,iVar4) <= this->parsedSize) break;
      pEVar5 = (Executable *)
               ResourceContentWrapper::getContentAt
                         (&this->super_ResourceContentWrapper,(offset_t)dataAddr,RAW,2);
      if (pEVar5 == (Executable *)0x0) {
        puts("Cannot fetch the string size!");
LAB_0013b6e8:
        bVar2 = true;
      }
      else {
        this->parsedSize = this->parsedSize + 2;
        dataAddr = (ExeNodeWrapper *)
                   ((long)&(dataAddr->super_ExeElementWrapper).super_AbstractByteBuffer.
                           _vptr_AbstractByteBuffer + 2);
        uVar1 = *(ushort *)&(pEVar5->super_AbstractByteBuffer)._vptr_AbstractByteBuffer;
        if (uVar1 == 0) {
          bVar2 = false;
        }
        else {
          dataSize = (ulong)((uint)uVar1 * 2);
          pp_Var6 = (_func_int **)
                    ResourceContentWrapper::getContentAt
                              (&this->super_ResourceContentWrapper,(offset_t)dataAddr,RAW,dataSize);
          if (pp_Var6 == (_func_int **)0x0) goto LAB_0013b6e8;
          exec = (((this->super_ResourceContentWrapper).myLeaf)->super_ExeNodeWrapper).
                 super_ExeElementWrapper.m_Exe;
          this_00 = (ExeNodeWrapper *)operator_new(0x50);
          ExeNodeWrapper::ExeNodeWrapper(this_00,exec,(ExeNodeWrapper *)0x0);
          (this_00->super_ExeElementWrapper).super_AbstractByteBuffer._vptr_AbstractByteBuffer =
               (_func_int **)&PTR__ExeNodeWrapper_001596f8;
          this_00[1].super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer =
               pp_Var6;
          this_00[1].super_ExeElementWrapper.m_Exe = pEVar5;
          this_00[1].parentNode = dataAddr;
          local_38 = this_00;
          std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::
          emplace_back<ExeNodeWrapper*>
                    ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                     &(this->super_ResourceContentWrapper).super_ExeNodeWrapper.entries,&local_38);
          this->parsedSize = this->parsedSize + dataSize;
          dataAddr = (ExeNodeWrapper *)
                     ((long)&(dataAddr->super_ExeElementWrapper).super_AbstractByteBuffer.
                             _vptr_AbstractByteBuffer + dataSize);
          bVar2 = false;
        }
      }
    } while (!bVar2);
  }
  return CONCAT44(extraout_var,iVar3) != 0;
}

Assistant:

bool ResourceStringsWrapper::wrap()
{
    clear();
    this->parsedSize = 0;

    BYTE *c = static_cast<BYTE*>(this->getPtr());
    if (!c) {
        return false;
    }
    size_t maxSize = this->getSize();
    //printf("maxSize = %x\n", maxSize);
    offset_t startRaw = getContentRaw();
    offset_t cRaw = startRaw;

    while (parsedSize < maxSize) {

        WORD* stringSize = (WORD*) this->getContentAt(cRaw, Executable::RAW, sizeof(WORD));
        if (stringSize == NULL){
            printf("Cannot fetch the string size!\n");
            break;
        }
        this->parsedSize += sizeof(WORD);
        cRaw += sizeof(WORD);

        size_t wStrSize = (*stringSize);
        if (wStrSize == 0) {
            continue;
        }
        bufsize_t totalStrSize = wStrSize * sizeof(WORD);

        WORD* uStringPtr = (WORD*) this->getContentAt(cRaw, Executable::RAW, totalStrSize);
        if (uStringPtr == NULL) break;

        Executable *exe = this->myLeaf->getExe();
        ResString *rStr = new ResString(uStringPtr, stringSize, cRaw, exe);
        this->entries.push_back(rStr);

        this->parsedSize += totalStrSize;
        cRaw += totalStrSize;
    }
    return true;
}